

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiID id;
  char *str;
  int rounding_corners;
  bool bVar2;
  ImRect bb;
  ImRect local_28;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_28 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (this->ScrollbarY ^ 1) * 8 + 4;
  }
  else {
    bVar2 = (this->Flags & 0x401U) == 1;
    rounding_corners = (uint)bVar2 * 2 + 8;
    if (this->ScrollbarX != false) {
      rounding_corners = (uint)bVar2 * 2;
    }
  }
  if (1 < (uint)axis) {
    __assert_fail("idx <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                  ,0xe5,"float &ImVec2::operator[](size_t)");
  }
  fVar1 = (&(this->WindowPadding).x)[(uint)axis];
  ScrollbarEx(&local_28,id,axis,&(this->Scroll).x + (uint)axis,
              (&(this->InnerRect).Max.x)[(uint)axis] - (&(this->InnerRect).Min.x)[(uint)axis],
              fVar1 + fVar1 + (&(this->ContentSize).x)[(uint)axis],rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}